

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int diff_hdrs(nifti_1_header *s0,nifti_1_header *s1,int display)

{
  int iVar1;
  int local_30;
  int local_2c;
  int ndiff;
  int c;
  field_s *fp;
  int display_local;
  nifti_1_header *s1_local;
  nifti_1_header *s0_local;
  
  _ndiff = g_hdr_fields;
  local_30 = 0;
  for (local_2c = 0; local_2c < 0x2b; local_2c = local_2c + 1) {
    iVar1 = diff_field(_ndiff,s0,s1,1);
    if (iVar1 != 0) {
      if (display != 0) {
        disp_field((char *)0x0,_ndiff,s0,1,(uint)(local_30 == 0));
        disp_field((char *)0x0,_ndiff,s1,1,0);
      }
      local_30 = local_30 + 1;
    }
    _ndiff = _ndiff + 1;
  }
  return local_30;
}

Assistant:

int diff_hdrs( nifti_1_header * s0, nifti_1_header * s1, int display )
{
   field_s * fp = g_hdr_fields;
   int       c, ndiff = 0;

   for( c = 0; c < NT_HDR_NUM_FIELDS; c++, fp++ )
      if( diff_field(fp, s0, s1, 1) )
      {
         if( display ) disp_field(NULL, fp, s0, 1, ndiff == 0);
         if( display ) disp_field(NULL, fp, s1, 1, 0);
         ndiff++;
      }

   return ndiff;
}